

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool __thiscall
duckdb::TryCastDecimalToFloatingPoint<duckdb::hugeint_t,double>
          (duckdb *this,hugeint_t input,double *result,uint8_t scale)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  hugeint_t lhs;
  hugeint_t hVar4;
  hugeint_t div;
  hugeint_t mod;
  hugeint_t local_60;
  hugeint_t local_50;
  hugeint_t local_40;
  
  lhs.upper = input.lower;
  local_60.upper = lhs.upper;
  local_60.lower = (uint64_t)this;
  hugeint_t::hugeint_t(&local_50,0x20000000000000);
  bVar1 = hugeint_t::operator<=(&local_60,&local_50);
  if (bVar1) {
    hugeint_t::hugeint_t(&local_40,-0x20000000000000);
    bVar1 = hugeint_t::operator>=(&local_60,&local_40);
  }
  else {
    bVar1 = false;
  }
  if (((char)result == '\0') || (bVar1 != false)) {
    hVar4.upper = lhs.upper;
    hVar4.lower = (uint64_t)this;
    dVar2 = Cast::Operation<duckdb::hugeint_t,double>(hVar4);
    dVar2 = dVar2 / *(double *)(NumericHelper::DOUBLE_POWERS_OF_TEN + ((ulong)result & 0xff) * 8);
  }
  else {
    hVar4 = *(hugeint_t *)(Hugeint::POWERS_OF_TEN + (uint)((int)((ulong)result & 0xff) << 4));
    hugeint_t::hugeint_t(&local_60,0);
    hugeint_t::hugeint_t(&local_50,0);
    lhs.lower = (uint64_t)this;
    local_60 = Hugeint::DivMod(lhs,hVar4,&local_50);
    dVar2 = Cast::Operation<duckdb::hugeint_t,double>(local_60);
    dVar3 = Cast::Operation<duckdb::hugeint_t,double>(local_50);
    dVar2 = dVar3 / *(double *)(NumericHelper::DOUBLE_POWERS_OF_TEN + ((ulong)result & 0xff) * 8) +
            dVar2;
  }
  *(double *)input.upper = dVar2;
  return true;
}

Assistant:

bool TryCastDecimalToFloatingPoint(SRC input, DST &result, uint8_t scale) {
	if (IsRepresentableExactly<SRC, DST>(input, DST(0.0)) || scale == 0) {
		// Fast path, integer is representable exaclty as a float/double
		result = Cast::Operation<SRC, DST>(input) / DST(NumericHelper::DOUBLE_POWERS_OF_TEN[scale]);
		return true;
	}
	auto power_of_ten = GetPowerOfTen(input, scale);

	SRC div = 0;
	SRC mod = 0;
	GetDivMod(input, power_of_ten, div, mod);

	result = Cast::Operation<SRC, DST>(div) +
	         Cast::Operation<SRC, DST>(mod) / DST(NumericHelper::DOUBLE_POWERS_OF_TEN[scale]);
	return true;
}